

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

wchar_t cmp_u16n(uint16_t *a,uint16_t *b,size_t na,size_t nb)

{
  ulong local_40;
  size_t ib;
  size_t ia;
  size_t nb_local;
  size_t na_local;
  uint16_t *b_local;
  uint16_t *a_local;
  
  ib = 0;
  local_40 = 0;
  if (na < nb) {
    for (; local_40 < nb - na; local_40 = local_40 + 1) {
      if (b[local_40] != 0) {
        return L'\xffffffff';
      }
    }
  }
  else {
    for (; ib < na - nb; ib = ib + 1) {
      if (a[ib] != 0) {
        return L'\x01';
      }
    }
  }
  while( true ) {
    if (na <= ib) {
      return L'\0';
    }
    if (nb <= local_40) {
      __assert_fail("ib < nb",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x462,"int cmp_u16n(const uint16_t *, const uint16_t *, size_t, size_t)");
    }
    if (b[local_40] < a[ib]) {
      return L'\x01';
    }
    if (a[ib] < b[local_40]) break;
    ib = ib + 1;
    local_40 = local_40 + 1;
  }
  return L'\xffffffff';
}

Assistant:

static int cmp_u16n(const uint16_t *a, const uint16_t *b, size_t na, size_t nb)
{
	size_t ia = 0, ib = 0;

	if (na >= nb) {
		while (ia < na - nb) {
			if (a[ia]) {
				return 1;
			}
			++ia;
		}
	} else {
		while (ib < nb - na) {
			if (b[ib]) {
				return -1;
			}
			++ib;
		}
	}
	while (ia < na) {
		assert(ib < nb);
		if (a[ia] > b[ib]) {
			return 1;
		}
		if (a[ia] < b[ib]) {
			return -1;
		}
		++ia;
		++ib;
	}
	return 0;
}